

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O2

void __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_false>::CaptureSourceAndGroups
          (Parser<UTF8EncodingPolicyBase<false>,_false> *this,Recycler *recycler,Program *program,
          EncodedChar *body,CharCount bodyChars,CharCount bodyEncodedChars)

{
  code *pcVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  Recycler *this_00;
  char16_t *ptr;
  undefined1 local_68 [8];
  TrackAllocData data;
  
  data._32_8_ = this;
  if ((program->source).ptr != (char16_t *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xbfa,"(program->source == 0)","program->source == 0");
    if (!bVar3) goto LAB_00d2988d;
    *puVar5 = 0;
  }
  if (body == (EncodedChar *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xbfb,"(body != 0)","body != 0");
    if (!bVar3) goto LAB_00d2988d;
    *puVar5 = 0;
  }
  local_68 = (undefined1  [8])&char16_t::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_a579762;
  data.filename._0_4_ = 0xbfe;
  data.plusSize = (ulong)(bodyChars + 1);
  this_00 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_68);
  ptr = Memory::AllocateArray<Memory::Recycler,char16_t,false>
                  ((Memory *)this_00,(Recycler *)Memory::Recycler::AllocLeaf,0,
                   (ulong)(bodyChars + 1));
  Memory::WriteBarrierPtr<char16_t>::WriteBarrierSet(&program->source,ptr);
  uVar2 = data._32_8_;
  UTF8EncodingPolicyBase<false>::ConvertToUnicode
            ((UTF8EncodingPolicyBase<false> *)data._32_8_,(program->source).ptr,bodyChars,body,
             body + bodyEncodedChars);
  (program->source).ptr[bodyChars] = L'\0';
  program->sourceLen = bodyChars;
  iVar4 = *(int *)(uVar2 + 0x54);
  if (iVar4 < 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xc07,"(nextGroupId > 0)","nextGroupId > 0");
    if (!bVar3) {
LAB_00d2988d:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
    iVar4 = *(int *)(uVar2 + 0x54);
  }
  if (iVar4 < 0x8000) {
    program->numGroups = (Type)iVar4;
    return;
  }
  Js::JavascriptError::ThrowRangeError(*(ScriptContext **)(uVar2 + 0x10),-0x7ff5e9d5,(PCWSTR)0x0);
}

Assistant:

void Parser<P, IsLiteral>::CaptureSourceAndGroups(Recycler* recycler, Program* program, const EncodedChar* body, CharCount bodyChars, CharCount bodyEncodedChars)
    {
        Assert(program->source == 0);
        Assert(body != 0);

        // Program will own source string
        program->source = RecyclerNewArrayLeaf(recycler, Char, bodyChars + 1);
        // Don't need to zero out since we're writing to the buffer right here
        this->ConvertToUnicode(program->source, bodyChars, body, body + bodyEncodedChars);

        program->source[bodyChars] = 0;
        program->sourceLen = bodyChars;

        // We expect nextGroupId to be positive, because the full regexp itself always
        // counts as a capturing group.
        Assert(nextGroupId > 0);
        if (nextGroupId > MAX_NUM_GROUPS)
        {
            Js::JavascriptError::ThrowRangeError(this->scriptContext, JSERR_RegExpTooManyCapturingGroups);
        }
        else
        {
            program->numGroups = static_cast<uint16>(nextGroupId);
        }

        // Remaining to set during compilation: litbuf, litbufLen, numLoops, insts, instsLen, entryPointLabel
    }